

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O0

int pospopcnt_u16_avx2_adder_forest(uint16_t *array,uint32_t len,uint32_t *flags)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 (*pauVar198) [32];
  undefined1 (*pauVar199) [32];
  undefined1 (*pauVar200) [32];
  undefined1 (*pauVar201) [32];
  undefined1 (*pauVar202) [32];
  undefined1 (*pauVar203) [32];
  undefined1 (*pauVar204) [32];
  undefined1 (*pauVar205) [32];
  undefined1 (*pauVar206) [32];
  undefined1 (*pauVar207) [32];
  undefined1 (*pauVar208) [32];
  undefined1 (*pauVar209) [32];
  undefined1 (*pauVar210) [32];
  undefined1 (*pauVar211) [32];
  undefined1 (*pauVar212) [32];
  undefined1 (*pauVar213) [32];
  long lVar214;
  long in_RDX;
  uint in_ESI;
  long in_RDI;
  undefined1 auVar215 [32];
  int j_3;
  size_t i_4;
  int j_2;
  __m256i sum1415_8bit_odd_1;
  __m256i sum1213_8bit_odd_1;
  __m256i sum1011_8bit_odd_1;
  __m256i sum89_8bit_odd_1;
  __m256i sum67_8bit_odd_1;
  __m256i sum45_8bit_odd_1;
  __m256i sum23_8bit_odd_1;
  __m256i sum01_8bit_odd_1;
  __m256i sum1415_8bit_even_1;
  __m256i sum1213_8bit_even_1;
  __m256i sum1011_8bit_even_1;
  __m256i sum89_8bit_even_1;
  __m256i sum67_8bit_even_1;
  __m256i sum45_8bit_even_1;
  __m256i sum23_8bit_even_1;
  __m256i sum01_8bit_even_1;
  __m256i sum1415_4bit_odd_1;
  __m256i sum1213_4bit_odd_1;
  __m256i sum1011_4bit_odd_1;
  __m256i sum89_4bit_odd_1;
  __m256i sum67_4bit_odd_1;
  __m256i sum45_4bit_odd_1;
  __m256i sum23_4bit_odd_1;
  __m256i sum01_4bit_odd_1;
  __m256i sum1415_4bit_even_1;
  __m256i sum1213_4bit_even_1;
  __m256i sum1011_4bit_even_1;
  __m256i sum89_4bit_even_1;
  __m256i sum67_4bit_even_1;
  __m256i sum45_4bit_even_1;
  __m256i sum23_4bit_even_1;
  __m256i sum01_4bit_even_1;
  __m256i sum1415_2bit_odd_1;
  __m256i sum1213_2bit_odd_1;
  __m256i sum1011_2bit_odd_1;
  __m256i sum89_2bit_odd_1;
  __m256i sum67_2bit_odd_1;
  __m256i sum45_2bit_odd_1;
  __m256i sum23_2bit_odd_1;
  __m256i sum01_2bit_odd_1;
  __m256i sum1415_2bit_even_1;
  __m256i sum1213_2bit_even_1;
  __m256i sum1011_2bit_even_1;
  __m256i sum89_2bit_even_1;
  __m256i sum67_2bit_even_1;
  __m256i sum45_2bit_even_1;
  __m256i sum23_2bit_even_1;
  __m256i sum01_2bit_even_1;
  __m256i sum1415_1bit_odd_1;
  __m256i sum1213_1bit_odd_1;
  __m256i sum1011_1bit_odd_1;
  __m256i sum89_1bit_odd_1;
  __m256i sum67_1bit_odd_1;
  __m256i sum45_1bit_odd_1;
  __m256i sum23_1bit_odd_1;
  __m256i sum01_1bit_odd_1;
  __m256i sum1415_1bit_even_1;
  __m256i sum1213_1bit_even_1;
  __m256i sum1011_1bit_even_1;
  __m256i sum89_1bit_even_1;
  __m256i sum67_1bit_even_1;
  __m256i sum45_1bit_even_1;
  __m256i sum23_1bit_even_1;
  __m256i sum01_1bit_even_1;
  __m256i input15_1;
  __m256i input14_1;
  __m256i input13_1;
  __m256i input12_1;
  __m256i input11_1;
  __m256i input10_1;
  __m256i input9_1;
  __m256i input8_1;
  __m256i input7_1;
  __m256i input6_1;
  __m256i input5_1;
  __m256i input4_1;
  __m256i input3_1;
  __m256i input2_1;
  __m256i input1_1;
  __m256i input0_1;
  size_t i_3;
  int j_1;
  size_t i_2;
  __m256i sum1415_8bit_odd;
  __m256i sum1213_8bit_odd;
  __m256i sum1011_8bit_odd;
  __m256i sum89_8bit_odd;
  __m256i sum67_8bit_odd;
  __m256i sum45_8bit_odd;
  __m256i sum23_8bit_odd;
  __m256i sum01_8bit_odd;
  __m256i sum1415_8bit_even;
  __m256i sum1213_8bit_even;
  __m256i sum1011_8bit_even;
  __m256i sum89_8bit_even;
  __m256i sum67_8bit_even;
  __m256i sum45_8bit_even;
  __m256i sum23_8bit_even;
  __m256i sum01_8bit_even;
  __m256i sum1415_4bit_odd;
  __m256i sum1213_4bit_odd;
  __m256i sum1011_4bit_odd;
  __m256i sum89_4bit_odd;
  __m256i sum67_4bit_odd;
  __m256i sum45_4bit_odd;
  __m256i sum23_4bit_odd;
  __m256i sum01_4bit_odd;
  __m256i sum1415_4bit_even;
  __m256i sum1213_4bit_even;
  __m256i sum1011_4bit_even;
  __m256i sum89_4bit_even;
  __m256i sum67_4bit_even;
  __m256i sum45_4bit_even;
  __m256i sum23_4bit_even;
  __m256i sum01_4bit_even;
  __m256i sum1415_2bit_odd;
  __m256i sum1213_2bit_odd;
  __m256i sum1011_2bit_odd;
  __m256i sum89_2bit_odd;
  __m256i sum67_2bit_odd;
  __m256i sum45_2bit_odd;
  __m256i sum23_2bit_odd;
  __m256i sum01_2bit_odd;
  __m256i sum1415_2bit_even;
  __m256i sum1213_2bit_even;
  __m256i sum1011_2bit_even;
  __m256i sum89_2bit_even;
  __m256i sum67_2bit_even;
  __m256i sum45_2bit_even;
  __m256i sum23_2bit_even;
  __m256i sum01_2bit_even;
  __m256i sum1415_1bit_odd;
  __m256i sum1213_1bit_odd;
  __m256i sum1011_1bit_odd;
  __m256i sum89_1bit_odd;
  __m256i sum67_1bit_odd;
  __m256i sum45_1bit_odd;
  __m256i sum23_1bit_odd;
  __m256i sum01_1bit_odd;
  __m256i sum1415_1bit_even;
  __m256i sum1213_1bit_even;
  __m256i sum1011_1bit_even;
  __m256i sum89_1bit_even;
  __m256i sum67_1bit_even;
  __m256i sum45_1bit_even;
  __m256i sum23_1bit_even;
  __m256i sum01_1bit_even;
  __m256i input15;
  __m256i input14;
  __m256i input13;
  __m256i input12;
  __m256i input11;
  __m256i input10;
  __m256i input9;
  __m256i input8;
  __m256i input7;
  __m256i input6;
  __m256i input5;
  __m256i input4;
  __m256i input3;
  __m256i input2;
  __m256i input1;
  __m256i input0;
  int j;
  size_t i;
  uint16_t tmp [16];
  uint32_t n_total;
  uint32_t n_cycles;
  __m256i mask8bit;
  __m256i mask4bit;
  __m256i mask2bit;
  __m256i mask1bit;
  size_t i_1;
  __m256i counters [16];
  int local_6234;
  ulong local_6230;
  int local_6224;
  ulong local_5818;
  int local_580c;
  ulong local_5808;
  int local_4dfc;
  ulong local_4df8;
  undefined1 local_4df0 [6] [32];
  ulong local_4d28;
  undefined1 local_4d20 [32];
  undefined1 local_4d00 [32];
  undefined1 local_4ce0 [32];
  undefined1 local_4cc0 [32];
  undefined1 local_4ca0 [32];
  undefined1 local_4c80 [32];
  undefined1 local_4c60 [32];
  undefined1 local_4c40 [32];
  undefined1 local_4c20 [32];
  undefined1 local_4c00 [32];
  undefined1 local_4be0 [32];
  undefined1 local_4bc0 [32];
  undefined1 local_4ba0 [32];
  undefined1 local_4b80 [32];
  undefined1 local_4b60 [32];
  undefined1 local_4b40 [32];
  undefined8 uStack_21f0;
  undefined8 uStack_21e8;
  undefined8 uStack_21b0;
  undefined8 uStack_21a8;
  undefined8 uStack_2170;
  undefined8 uStack_2168;
  
  for (local_4d28 = 0; local_4d28 < 0x10; local_4d28 = local_4d28 + 1) {
    lVar214 = local_4d28 * 0x20;
    *(undefined8 *)(local_4d20 + lVar214) = 0;
    *(undefined8 *)(local_4d20 + lVar214 + 8) = 0;
    *(undefined8 *)(local_4d20 + lVar214 + 0x10) = 0;
    *(undefined8 *)(local_4d00 + lVar214 + -8) = 0;
  }
  auVar1 = vpinsrw_avx(ZEXT216(0x5555),0x5555,1);
  auVar1 = vpinsrw_avx(auVar1,0x5555,2);
  auVar1 = vpinsrw_avx(auVar1,0x5555,3);
  auVar1 = vpinsrw_avx(auVar1,0x5555,4);
  auVar1 = vpinsrw_avx(auVar1,0x5555,5);
  auVar1 = vpinsrw_avx(auVar1,0x5555,6);
  auVar1 = vpinsrw_avx(auVar1,0x5555,7);
  auVar2 = vpinsrw_avx(ZEXT216(0x5555),0x5555,1);
  auVar2 = vpinsrw_avx(auVar2,0x5555,2);
  auVar2 = vpinsrw_avx(auVar2,0x5555,3);
  auVar2 = vpinsrw_avx(auVar2,0x5555,4);
  auVar2 = vpinsrw_avx(auVar2,0x5555,5);
  auVar2 = vpinsrw_avx(auVar2,0x5555,6);
  auVar2 = vpinsrw_avx(auVar2,0x5555,7);
  uStack_21f0 = auVar2._0_8_;
  uStack_21e8 = auVar2._8_8_;
  auVar2 = vpinsrw_avx(ZEXT216(0x3333),0x3333,1);
  auVar2 = vpinsrw_avx(auVar2,0x3333,2);
  auVar2 = vpinsrw_avx(auVar2,0x3333,3);
  auVar2 = vpinsrw_avx(auVar2,0x3333,4);
  auVar2 = vpinsrw_avx(auVar2,0x3333,5);
  auVar2 = vpinsrw_avx(auVar2,0x3333,6);
  auVar2 = vpinsrw_avx(auVar2,0x3333,7);
  auVar3 = vpinsrw_avx(ZEXT216(0x3333),0x3333,1);
  auVar3 = vpinsrw_avx(auVar3,0x3333,2);
  auVar3 = vpinsrw_avx(auVar3,0x3333,3);
  auVar3 = vpinsrw_avx(auVar3,0x3333,4);
  auVar3 = vpinsrw_avx(auVar3,0x3333,5);
  auVar3 = vpinsrw_avx(auVar3,0x3333,6);
  auVar3 = vpinsrw_avx(auVar3,0x3333,7);
  uStack_21b0 = auVar3._0_8_;
  uStack_21a8 = auVar3._8_8_;
  auVar3 = vpinsrw_avx(ZEXT216(0xf0f),0xf0f,1);
  auVar3 = vpinsrw_avx(auVar3,0xf0f,2);
  auVar3 = vpinsrw_avx(auVar3,0xf0f,3);
  auVar3 = vpinsrw_avx(auVar3,0xf0f,4);
  auVar3 = vpinsrw_avx(auVar3,0xf0f,5);
  auVar3 = vpinsrw_avx(auVar3,0xf0f,6);
  auVar3 = vpinsrw_avx(auVar3,0xf0f,7);
  auVar4 = vpinsrw_avx(ZEXT216(0xf0f),0xf0f,1);
  auVar4 = vpinsrw_avx(auVar4,0xf0f,2);
  auVar4 = vpinsrw_avx(auVar4,0xf0f,3);
  auVar4 = vpinsrw_avx(auVar4,0xf0f,4);
  auVar4 = vpinsrw_avx(auVar4,0xf0f,5);
  auVar4 = vpinsrw_avx(auVar4,0xf0f,6);
  auVar4 = vpinsrw_avx(auVar4,0xf0f,7);
  uStack_2170 = auVar4._0_8_;
  uStack_2168 = auVar4._8_8_;
  auVar4 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
  auVar4 = vpinsrw_avx(auVar4,0xff,2);
  auVar4 = vpinsrw_avx(auVar4,0xff,3);
  auVar4 = vpinsrw_avx(auVar4,0xff,4);
  auVar4 = vpinsrw_avx(auVar4,0xff,5);
  auVar4 = vpinsrw_avx(auVar4,0xff,6);
  auVar4 = vpinsrw_avx(auVar4,0xff,7);
  auVar5 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
  auVar5 = vpinsrw_avx(auVar5,0xff,2);
  auVar5 = vpinsrw_avx(auVar5,0xff,3);
  auVar5 = vpinsrw_avx(auVar5,0xff,4);
  auVar5 = vpinsrw_avx(auVar5,0xff,5);
  auVar5 = vpinsrw_avx(auVar5,0xff,6);
  auVar5 = vpinsrw_avx(auVar5,0xff,7);
  auVar215._0_16_ = ZEXT116(0) * auVar4 + ZEXT116(1) * auVar5;
  auVar215._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar4;
  for (local_4df8 = 0; local_4df8 < in_ESI >> 0x14; local_4df8 = local_4df8 + 1) {
    for (local_4dfc = 0; local_4dfc < 0x1000; local_4dfc = local_4dfc + 1) {
      pauVar198 = (undefined1 (*) [32])
                  (in_RDI + local_4df8 * 0x200000 + (long)(local_4dfc << 8) * 2);
      pauVar199 = (undefined1 (*) [32])
                  (in_RDI + local_4df8 * 0x200000 + (long)(local_4dfc << 8) * 2 + 0x20);
      pauVar200 = (undefined1 (*) [32])
                  (in_RDI + local_4df8 * 0x200000 + (long)(local_4dfc << 8) * 2 + 0x40);
      pauVar201 = (undefined1 (*) [32])
                  (in_RDI + local_4df8 * 0x200000 + (long)(local_4dfc << 8) * 2 + 0x60);
      pauVar202 = (undefined1 (*) [32])
                  (in_RDI + local_4df8 * 0x200000 + (long)(local_4dfc << 8) * 2 + 0x80);
      pauVar203 = (undefined1 (*) [32])
                  (in_RDI + local_4df8 * 0x200000 + (long)(local_4dfc << 8) * 2 + 0xa0);
      pauVar204 = (undefined1 (*) [32])
                  (in_RDI + local_4df8 * 0x200000 + (long)(local_4dfc << 8) * 2 + 0xc0);
      pauVar205 = (undefined1 (*) [32])
                  (in_RDI + local_4df8 * 0x200000 + (long)(local_4dfc << 8) * 2 + 0xe0);
      pauVar206 = (undefined1 (*) [32])
                  (in_RDI + local_4df8 * 0x200000 + (long)(local_4dfc << 8) * 2 + 0x100);
      pauVar207 = (undefined1 (*) [32])
                  (in_RDI + local_4df8 * 0x200000 + (long)(local_4dfc << 8) * 2 + 0x120);
      pauVar208 = (undefined1 (*) [32])
                  (in_RDI + local_4df8 * 0x200000 + (long)(local_4dfc << 8) * 2 + 0x140);
      pauVar209 = (undefined1 (*) [32])
                  (in_RDI + local_4df8 * 0x200000 + (long)(local_4dfc << 8) * 2 + 0x160);
      pauVar210 = (undefined1 (*) [32])
                  (in_RDI + local_4df8 * 0x200000 + (long)(local_4dfc << 8) * 2 + 0x180);
      pauVar211 = (undefined1 (*) [32])
                  (in_RDI + local_4df8 * 0x200000 + (long)(local_4dfc << 8) * 2 + 0x1a0);
      pauVar212 = (undefined1 (*) [32])
                  (in_RDI + local_4df8 * 0x200000 + (long)(local_4dfc << 8) * 2 + 0x1c0);
      pauVar213 = (undefined1 (*) [32])
                  (in_RDI + local_4df8 * 0x200000 + (long)(local_4dfc << 8) * 2 + 0x1e0);
      auVar136._16_8_ = uStack_21f0;
      auVar136._0_16_ = auVar1;
      auVar136._24_8_ = uStack_21e8;
      auVar6 = vpand_avx2(*pauVar198,auVar136);
      auVar137._16_8_ = uStack_21f0;
      auVar137._0_16_ = auVar1;
      auVar137._24_8_ = uStack_21e8;
      auVar7 = vpand_avx2(*pauVar199,auVar137);
      auVar6 = vpaddb_avx2(auVar6,auVar7);
      auVar138._16_8_ = uStack_21f0;
      auVar138._0_16_ = auVar1;
      auVar138._24_8_ = uStack_21e8;
      auVar7 = vpand_avx2(*pauVar200,auVar138);
      auVar139._16_8_ = uStack_21f0;
      auVar139._0_16_ = auVar1;
      auVar139._24_8_ = uStack_21e8;
      auVar8 = vpand_avx2(*pauVar201,auVar139);
      auVar7 = vpaddb_avx2(auVar7,auVar8);
      auVar140._16_8_ = uStack_21f0;
      auVar140._0_16_ = auVar1;
      auVar140._24_8_ = uStack_21e8;
      auVar8 = vpand_avx2(*pauVar202,auVar140);
      auVar141._16_8_ = uStack_21f0;
      auVar141._0_16_ = auVar1;
      auVar141._24_8_ = uStack_21e8;
      auVar9 = vpand_avx2(*pauVar203,auVar141);
      auVar8 = vpaddb_avx2(auVar8,auVar9);
      auVar142._16_8_ = uStack_21f0;
      auVar142._0_16_ = auVar1;
      auVar142._24_8_ = uStack_21e8;
      auVar9 = vpand_avx2(*pauVar204,auVar142);
      auVar143._16_8_ = uStack_21f0;
      auVar143._0_16_ = auVar1;
      auVar143._24_8_ = uStack_21e8;
      auVar10 = vpand_avx2(*pauVar205,auVar143);
      auVar9 = vpaddb_avx2(auVar9,auVar10);
      auVar144._16_8_ = uStack_21f0;
      auVar144._0_16_ = auVar1;
      auVar144._24_8_ = uStack_21e8;
      auVar10 = vpand_avx2(*pauVar206,auVar144);
      auVar145._16_8_ = uStack_21f0;
      auVar145._0_16_ = auVar1;
      auVar145._24_8_ = uStack_21e8;
      auVar11 = vpand_avx2(*pauVar207,auVar145);
      auVar10 = vpaddb_avx2(auVar10,auVar11);
      auVar146._16_8_ = uStack_21f0;
      auVar146._0_16_ = auVar1;
      auVar146._24_8_ = uStack_21e8;
      auVar11 = vpand_avx2(*pauVar208,auVar146);
      auVar147._16_8_ = uStack_21f0;
      auVar147._0_16_ = auVar1;
      auVar147._24_8_ = uStack_21e8;
      auVar12 = vpand_avx2(*pauVar209,auVar147);
      auVar11 = vpaddb_avx2(auVar11,auVar12);
      auVar148._16_8_ = uStack_21f0;
      auVar148._0_16_ = auVar1;
      auVar148._24_8_ = uStack_21e8;
      auVar12 = vpand_avx2(*pauVar210,auVar148);
      auVar149._16_8_ = uStack_21f0;
      auVar149._0_16_ = auVar1;
      auVar149._24_8_ = uStack_21e8;
      auVar13 = vpand_avx2(*pauVar211,auVar149);
      auVar12 = vpaddb_avx2(auVar12,auVar13);
      auVar150._16_8_ = uStack_21f0;
      auVar150._0_16_ = auVar1;
      auVar150._24_8_ = uStack_21e8;
      auVar13 = vpand_avx2(*pauVar212,auVar150);
      auVar151._16_8_ = uStack_21f0;
      auVar151._0_16_ = auVar1;
      auVar151._24_8_ = uStack_21e8;
      auVar14 = vpand_avx2(*pauVar213,auVar151);
      auVar13 = vpaddb_avx2(auVar13,auVar14);
      auVar14 = vpsrlw_avx2(*pauVar198,ZEXT416(1));
      auVar152._16_8_ = uStack_21f0;
      auVar152._0_16_ = auVar1;
      auVar152._24_8_ = uStack_21e8;
      auVar14 = vpand_avx2(auVar14,auVar152);
      auVar23 = vpsrlw_avx2(*pauVar199,ZEXT416(1));
      auVar153._16_8_ = uStack_21f0;
      auVar153._0_16_ = auVar1;
      auVar153._24_8_ = uStack_21e8;
      auVar23 = vpand_avx2(auVar23,auVar153);
      auVar14 = vpaddb_avx2(auVar14,auVar23);
      auVar23 = vpsrlw_avx2(*pauVar200,ZEXT416(1));
      auVar154._16_8_ = uStack_21f0;
      auVar154._0_16_ = auVar1;
      auVar154._24_8_ = uStack_21e8;
      auVar23 = vpand_avx2(auVar23,auVar154);
      auVar24 = vpsrlw_avx2(*pauVar201,ZEXT416(1));
      auVar155._16_8_ = uStack_21f0;
      auVar155._0_16_ = auVar1;
      auVar155._24_8_ = uStack_21e8;
      auVar24 = vpand_avx2(auVar24,auVar155);
      auVar23 = vpaddb_avx2(auVar23,auVar24);
      auVar24 = vpsrlw_avx2(*pauVar202,ZEXT416(1));
      auVar156._16_8_ = uStack_21f0;
      auVar156._0_16_ = auVar1;
      auVar156._24_8_ = uStack_21e8;
      auVar24 = vpand_avx2(auVar24,auVar156);
      auVar25 = vpsrlw_avx2(*pauVar203,ZEXT416(1));
      auVar157._16_8_ = uStack_21f0;
      auVar157._0_16_ = auVar1;
      auVar157._24_8_ = uStack_21e8;
      auVar25 = vpand_avx2(auVar25,auVar157);
      auVar24 = vpaddb_avx2(auVar24,auVar25);
      auVar25 = vpsrlw_avx2(*pauVar204,ZEXT416(1));
      auVar158._16_8_ = uStack_21f0;
      auVar158._0_16_ = auVar1;
      auVar158._24_8_ = uStack_21e8;
      auVar25 = vpand_avx2(auVar25,auVar158);
      auVar26 = vpsrlw_avx2(*pauVar205,ZEXT416(1));
      auVar159._16_8_ = uStack_21f0;
      auVar159._0_16_ = auVar1;
      auVar159._24_8_ = uStack_21e8;
      auVar26 = vpand_avx2(auVar26,auVar159);
      auVar25 = vpaddb_avx2(auVar25,auVar26);
      auVar26 = vpsrlw_avx2(*pauVar206,ZEXT416(1));
      auVar160._16_8_ = uStack_21f0;
      auVar160._0_16_ = auVar1;
      auVar160._24_8_ = uStack_21e8;
      auVar26 = vpand_avx2(auVar26,auVar160);
      auVar27 = vpsrlw_avx2(*pauVar207,ZEXT416(1));
      auVar161._16_8_ = uStack_21f0;
      auVar161._0_16_ = auVar1;
      auVar161._24_8_ = uStack_21e8;
      auVar27 = vpand_avx2(auVar27,auVar161);
      auVar26 = vpaddb_avx2(auVar26,auVar27);
      auVar27 = vpsrlw_avx2(*pauVar208,ZEXT416(1));
      auVar162._16_8_ = uStack_21f0;
      auVar162._0_16_ = auVar1;
      auVar162._24_8_ = uStack_21e8;
      auVar27 = vpand_avx2(auVar27,auVar162);
      auVar28 = vpsrlw_avx2(*pauVar209,ZEXT416(1));
      auVar163._16_8_ = uStack_21f0;
      auVar163._0_16_ = auVar1;
      auVar163._24_8_ = uStack_21e8;
      auVar28 = vpand_avx2(auVar28,auVar163);
      auVar27 = vpaddb_avx2(auVar27,auVar28);
      auVar28 = vpsrlw_avx2(*pauVar210,ZEXT416(1));
      auVar164._16_8_ = uStack_21f0;
      auVar164._0_16_ = auVar1;
      auVar164._24_8_ = uStack_21e8;
      auVar28 = vpand_avx2(auVar28,auVar164);
      auVar29 = vpsrlw_avx2(*pauVar211,ZEXT416(1));
      auVar165._16_8_ = uStack_21f0;
      auVar165._0_16_ = auVar1;
      auVar165._24_8_ = uStack_21e8;
      auVar29 = vpand_avx2(auVar29,auVar165);
      auVar28 = vpaddb_avx2(auVar28,auVar29);
      auVar29 = vpsrlw_avx2(*pauVar212,ZEXT416(1));
      auVar166._16_8_ = uStack_21f0;
      auVar166._0_16_ = auVar1;
      auVar166._24_8_ = uStack_21e8;
      auVar29 = vpand_avx2(auVar29,auVar166);
      auVar30 = vpsrlw_avx2(*pauVar213,ZEXT416(1));
      auVar167._16_8_ = uStack_21f0;
      auVar167._0_16_ = auVar1;
      auVar167._24_8_ = uStack_21e8;
      auVar30 = vpand_avx2(auVar30,auVar167);
      auVar29 = vpaddb_avx2(auVar29,auVar30);
      auVar74._16_8_ = uStack_21b0;
      auVar74._0_16_ = auVar2;
      auVar74._24_8_ = uStack_21a8;
      auVar30 = vpand_avx2(auVar6,auVar74);
      auVar75._16_8_ = uStack_21b0;
      auVar75._0_16_ = auVar2;
      auVar75._24_8_ = uStack_21a8;
      auVar15 = vpand_avx2(auVar7,auVar75);
      auVar30 = vpaddb_avx2(auVar30,auVar15);
      auVar76._16_8_ = uStack_21b0;
      auVar76._0_16_ = auVar2;
      auVar76._24_8_ = uStack_21a8;
      auVar15 = vpand_avx2(auVar8,auVar76);
      auVar77._16_8_ = uStack_21b0;
      auVar77._0_16_ = auVar2;
      auVar77._24_8_ = uStack_21a8;
      auVar16 = vpand_avx2(auVar9,auVar77);
      auVar15 = vpaddb_avx2(auVar15,auVar16);
      auVar78._16_8_ = uStack_21b0;
      auVar78._0_16_ = auVar2;
      auVar78._24_8_ = uStack_21a8;
      auVar16 = vpand_avx2(auVar10,auVar78);
      auVar79._16_8_ = uStack_21b0;
      auVar79._0_16_ = auVar2;
      auVar79._24_8_ = uStack_21a8;
      auVar17 = vpand_avx2(auVar11,auVar79);
      auVar16 = vpaddb_avx2(auVar16,auVar17);
      auVar80._16_8_ = uStack_21b0;
      auVar80._0_16_ = auVar2;
      auVar80._24_8_ = uStack_21a8;
      auVar17 = vpand_avx2(auVar12,auVar80);
      auVar81._16_8_ = uStack_21b0;
      auVar81._0_16_ = auVar2;
      auVar81._24_8_ = uStack_21a8;
      auVar18 = vpand_avx2(auVar13,auVar81);
      auVar17 = vpaddb_avx2(auVar17,auVar18);
      auVar82._16_8_ = uStack_21b0;
      auVar82._0_16_ = auVar2;
      auVar82._24_8_ = uStack_21a8;
      auVar18 = vpand_avx2(auVar14,auVar82);
      auVar83._16_8_ = uStack_21b0;
      auVar83._0_16_ = auVar2;
      auVar83._24_8_ = uStack_21a8;
      auVar19 = vpand_avx2(auVar23,auVar83);
      auVar18 = vpaddb_avx2(auVar18,auVar19);
      auVar84._16_8_ = uStack_21b0;
      auVar84._0_16_ = auVar2;
      auVar84._24_8_ = uStack_21a8;
      auVar19 = vpand_avx2(auVar24,auVar84);
      auVar85._16_8_ = uStack_21b0;
      auVar85._0_16_ = auVar2;
      auVar85._24_8_ = uStack_21a8;
      auVar20 = vpand_avx2(auVar25,auVar85);
      auVar19 = vpaddb_avx2(auVar19,auVar20);
      auVar86._16_8_ = uStack_21b0;
      auVar86._0_16_ = auVar2;
      auVar86._24_8_ = uStack_21a8;
      auVar20 = vpand_avx2(auVar26,auVar86);
      auVar87._16_8_ = uStack_21b0;
      auVar87._0_16_ = auVar2;
      auVar87._24_8_ = uStack_21a8;
      auVar21 = vpand_avx2(auVar27,auVar87);
      auVar20 = vpaddb_avx2(auVar20,auVar21);
      auVar88._16_8_ = uStack_21b0;
      auVar88._0_16_ = auVar2;
      auVar88._24_8_ = uStack_21a8;
      auVar21 = vpand_avx2(auVar28,auVar88);
      auVar89._16_8_ = uStack_21b0;
      auVar89._0_16_ = auVar2;
      auVar89._24_8_ = uStack_21a8;
      auVar22 = vpand_avx2(auVar29,auVar89);
      auVar21 = vpaddb_avx2(auVar21,auVar22);
      auVar6 = vpsrlw_avx2(auVar6,ZEXT416(2));
      auVar90._16_8_ = uStack_21b0;
      auVar90._0_16_ = auVar2;
      auVar90._24_8_ = uStack_21a8;
      auVar6 = vpand_avx2(auVar6,auVar90);
      auVar7 = vpsrlw_avx2(auVar7,ZEXT416(2));
      auVar91._16_8_ = uStack_21b0;
      auVar91._0_16_ = auVar2;
      auVar91._24_8_ = uStack_21a8;
      auVar7 = vpand_avx2(auVar7,auVar91);
      auVar6 = vpaddb_avx2(auVar6,auVar7);
      auVar7 = vpsrlw_avx2(auVar8,ZEXT416(2));
      auVar92._16_8_ = uStack_21b0;
      auVar92._0_16_ = auVar2;
      auVar92._24_8_ = uStack_21a8;
      auVar7 = vpand_avx2(auVar7,auVar92);
      auVar8 = vpsrlw_avx2(auVar9,ZEXT416(2));
      auVar93._16_8_ = uStack_21b0;
      auVar93._0_16_ = auVar2;
      auVar93._24_8_ = uStack_21a8;
      auVar8 = vpand_avx2(auVar8,auVar93);
      auVar7 = vpaddb_avx2(auVar7,auVar8);
      auVar8 = vpsrlw_avx2(auVar10,ZEXT416(2));
      auVar94._16_8_ = uStack_21b0;
      auVar94._0_16_ = auVar2;
      auVar94._24_8_ = uStack_21a8;
      auVar8 = vpand_avx2(auVar8,auVar94);
      auVar9 = vpsrlw_avx2(auVar11,ZEXT416(2));
      auVar95._16_8_ = uStack_21b0;
      auVar95._0_16_ = auVar2;
      auVar95._24_8_ = uStack_21a8;
      auVar9 = vpand_avx2(auVar9,auVar95);
      auVar8 = vpaddb_avx2(auVar8,auVar9);
      auVar9 = vpsrlw_avx2(auVar12,ZEXT416(2));
      auVar96._16_8_ = uStack_21b0;
      auVar96._0_16_ = auVar2;
      auVar96._24_8_ = uStack_21a8;
      auVar9 = vpand_avx2(auVar9,auVar96);
      auVar10 = vpsrlw_avx2(auVar13,ZEXT416(2));
      auVar97._16_8_ = uStack_21b0;
      auVar97._0_16_ = auVar2;
      auVar97._24_8_ = uStack_21a8;
      auVar10 = vpand_avx2(auVar10,auVar97);
      auVar9 = vpaddb_avx2(auVar9,auVar10);
      auVar10 = vpsrlw_avx2(auVar14,ZEXT416(2));
      auVar98._16_8_ = uStack_21b0;
      auVar98._0_16_ = auVar2;
      auVar98._24_8_ = uStack_21a8;
      auVar10 = vpand_avx2(auVar10,auVar98);
      auVar11 = vpsrlw_avx2(auVar23,ZEXT416(2));
      auVar99._16_8_ = uStack_21b0;
      auVar99._0_16_ = auVar2;
      auVar99._24_8_ = uStack_21a8;
      auVar11 = vpand_avx2(auVar11,auVar99);
      auVar10 = vpaddb_avx2(auVar10,auVar11);
      auVar11 = vpsrlw_avx2(auVar24,ZEXT416(2));
      auVar100._16_8_ = uStack_21b0;
      auVar100._0_16_ = auVar2;
      auVar100._24_8_ = uStack_21a8;
      auVar11 = vpand_avx2(auVar11,auVar100);
      auVar12 = vpsrlw_avx2(auVar25,ZEXT416(2));
      auVar101._16_8_ = uStack_21b0;
      auVar101._0_16_ = auVar2;
      auVar101._24_8_ = uStack_21a8;
      auVar12 = vpand_avx2(auVar12,auVar101);
      auVar11 = vpaddb_avx2(auVar11,auVar12);
      auVar12 = vpsrlw_avx2(auVar26,ZEXT416(2));
      auVar102._16_8_ = uStack_21b0;
      auVar102._0_16_ = auVar2;
      auVar102._24_8_ = uStack_21a8;
      auVar12 = vpand_avx2(auVar12,auVar102);
      auVar13 = vpsrlw_avx2(auVar27,ZEXT416(2));
      auVar103._16_8_ = uStack_21b0;
      auVar103._0_16_ = auVar2;
      auVar103._24_8_ = uStack_21a8;
      auVar13 = vpand_avx2(auVar13,auVar103);
      auVar12 = vpaddb_avx2(auVar12,auVar13);
      auVar13 = vpsrlw_avx2(auVar28,ZEXT416(2));
      auVar104._16_8_ = uStack_21b0;
      auVar104._0_16_ = auVar2;
      auVar104._24_8_ = uStack_21a8;
      auVar13 = vpand_avx2(auVar13,auVar104);
      auVar14 = vpsrlw_avx2(auVar29,ZEXT416(2));
      auVar105._16_8_ = uStack_21b0;
      auVar105._0_16_ = auVar2;
      auVar105._24_8_ = uStack_21a8;
      auVar14 = vpand_avx2(auVar14,auVar105);
      auVar13 = vpaddb_avx2(auVar13,auVar14);
      auVar31._16_8_ = uStack_2170;
      auVar31._0_16_ = auVar3;
      auVar31._24_8_ = uStack_2168;
      auVar14 = vpand_avx2(auVar30,auVar31);
      auVar32._16_8_ = uStack_2170;
      auVar32._0_16_ = auVar3;
      auVar32._24_8_ = uStack_2168;
      auVar23 = vpand_avx2(auVar15,auVar32);
      auVar14 = vpaddb_avx2(auVar14,auVar23);
      auVar33._16_8_ = uStack_2170;
      auVar33._0_16_ = auVar3;
      auVar33._24_8_ = uStack_2168;
      auVar23 = vpand_avx2(auVar16,auVar33);
      auVar34._16_8_ = uStack_2170;
      auVar34._0_16_ = auVar3;
      auVar34._24_8_ = uStack_2168;
      auVar24 = vpand_avx2(auVar17,auVar34);
      auVar23 = vpaddb_avx2(auVar23,auVar24);
      auVar35._16_8_ = uStack_2170;
      auVar35._0_16_ = auVar3;
      auVar35._24_8_ = uStack_2168;
      auVar24 = vpand_avx2(auVar18,auVar35);
      auVar36._16_8_ = uStack_2170;
      auVar36._0_16_ = auVar3;
      auVar36._24_8_ = uStack_2168;
      auVar25 = vpand_avx2(auVar19,auVar36);
      auVar24 = vpaddb_avx2(auVar24,auVar25);
      auVar37._16_8_ = uStack_2170;
      auVar37._0_16_ = auVar3;
      auVar37._24_8_ = uStack_2168;
      auVar25 = vpand_avx2(auVar20,auVar37);
      auVar38._16_8_ = uStack_2170;
      auVar38._0_16_ = auVar3;
      auVar38._24_8_ = uStack_2168;
      auVar26 = vpand_avx2(auVar21,auVar38);
      auVar25 = vpaddb_avx2(auVar25,auVar26);
      auVar39._16_8_ = uStack_2170;
      auVar39._0_16_ = auVar3;
      auVar39._24_8_ = uStack_2168;
      auVar26 = vpand_avx2(auVar6,auVar39);
      auVar40._16_8_ = uStack_2170;
      auVar40._0_16_ = auVar3;
      auVar40._24_8_ = uStack_2168;
      auVar27 = vpand_avx2(auVar7,auVar40);
      auVar26 = vpaddb_avx2(auVar26,auVar27);
      auVar41._16_8_ = uStack_2170;
      auVar41._0_16_ = auVar3;
      auVar41._24_8_ = uStack_2168;
      auVar27 = vpand_avx2(auVar8,auVar41);
      auVar42._16_8_ = uStack_2170;
      auVar42._0_16_ = auVar3;
      auVar42._24_8_ = uStack_2168;
      auVar28 = vpand_avx2(auVar9,auVar42);
      auVar27 = vpaddb_avx2(auVar27,auVar28);
      auVar43._16_8_ = uStack_2170;
      auVar43._0_16_ = auVar3;
      auVar43._24_8_ = uStack_2168;
      auVar28 = vpand_avx2(auVar10,auVar43);
      auVar44._16_8_ = uStack_2170;
      auVar44._0_16_ = auVar3;
      auVar44._24_8_ = uStack_2168;
      auVar29 = vpand_avx2(auVar11,auVar44);
      auVar28 = vpaddb_avx2(auVar28,auVar29);
      auVar45._16_8_ = uStack_2170;
      auVar45._0_16_ = auVar3;
      auVar45._24_8_ = uStack_2168;
      auVar29 = vpand_avx2(auVar12,auVar45);
      auVar46._16_8_ = uStack_2170;
      auVar46._0_16_ = auVar3;
      auVar46._24_8_ = uStack_2168;
      auVar22 = vpand_avx2(auVar13,auVar46);
      auVar29 = vpaddb_avx2(auVar29,auVar22);
      auVar30 = vpsrlw_avx2(auVar30,ZEXT416(4));
      auVar47._16_8_ = uStack_2170;
      auVar47._0_16_ = auVar3;
      auVar47._24_8_ = uStack_2168;
      auVar30 = vpand_avx2(auVar30,auVar47);
      auVar15 = vpsrlw_avx2(auVar15,ZEXT416(4));
      auVar48._16_8_ = uStack_2170;
      auVar48._0_16_ = auVar3;
      auVar48._24_8_ = uStack_2168;
      auVar15 = vpand_avx2(auVar15,auVar48);
      auVar30 = vpaddb_avx2(auVar30,auVar15);
      auVar15 = vpsrlw_avx2(auVar16,ZEXT416(4));
      auVar49._16_8_ = uStack_2170;
      auVar49._0_16_ = auVar3;
      auVar49._24_8_ = uStack_2168;
      auVar15 = vpand_avx2(auVar15,auVar49);
      auVar16 = vpsrlw_avx2(auVar17,ZEXT416(4));
      auVar50._16_8_ = uStack_2170;
      auVar50._0_16_ = auVar3;
      auVar50._24_8_ = uStack_2168;
      auVar16 = vpand_avx2(auVar16,auVar50);
      auVar15 = vpaddb_avx2(auVar15,auVar16);
      auVar16 = vpsrlw_avx2(auVar18,ZEXT416(4));
      auVar51._16_8_ = uStack_2170;
      auVar51._0_16_ = auVar3;
      auVar51._24_8_ = uStack_2168;
      auVar16 = vpand_avx2(auVar16,auVar51);
      auVar17 = vpsrlw_avx2(auVar19,ZEXT416(4));
      auVar52._16_8_ = uStack_2170;
      auVar52._0_16_ = auVar3;
      auVar52._24_8_ = uStack_2168;
      auVar17 = vpand_avx2(auVar17,auVar52);
      auVar16 = vpaddb_avx2(auVar16,auVar17);
      auVar17 = vpsrlw_avx2(auVar20,ZEXT416(4));
      auVar53._16_8_ = uStack_2170;
      auVar53._0_16_ = auVar3;
      auVar53._24_8_ = uStack_2168;
      auVar17 = vpand_avx2(auVar17,auVar53);
      auVar18 = vpsrlw_avx2(auVar21,ZEXT416(4));
      auVar54._16_8_ = uStack_2170;
      auVar54._0_16_ = auVar3;
      auVar54._24_8_ = uStack_2168;
      auVar18 = vpand_avx2(auVar18,auVar54);
      auVar17 = vpaddb_avx2(auVar17,auVar18);
      auVar6 = vpsrlw_avx2(auVar6,ZEXT416(4));
      auVar55._16_8_ = uStack_2170;
      auVar55._0_16_ = auVar3;
      auVar55._24_8_ = uStack_2168;
      auVar6 = vpand_avx2(auVar6,auVar55);
      auVar7 = vpsrlw_avx2(auVar7,ZEXT416(4));
      auVar56._16_8_ = uStack_2170;
      auVar56._0_16_ = auVar3;
      auVar56._24_8_ = uStack_2168;
      auVar7 = vpand_avx2(auVar7,auVar56);
      auVar6 = vpaddb_avx2(auVar6,auVar7);
      auVar7 = vpsrlw_avx2(auVar8,ZEXT416(4));
      auVar57._16_8_ = uStack_2170;
      auVar57._0_16_ = auVar3;
      auVar57._24_8_ = uStack_2168;
      auVar7 = vpand_avx2(auVar7,auVar57);
      auVar8 = vpsrlw_avx2(auVar9,ZEXT416(4));
      auVar58._16_8_ = uStack_2170;
      auVar58._0_16_ = auVar3;
      auVar58._24_8_ = uStack_2168;
      auVar8 = vpand_avx2(auVar8,auVar58);
      auVar7 = vpaddb_avx2(auVar7,auVar8);
      auVar8 = vpsrlw_avx2(auVar10,ZEXT416(4));
      auVar59._16_8_ = uStack_2170;
      auVar59._0_16_ = auVar3;
      auVar59._24_8_ = uStack_2168;
      auVar8 = vpand_avx2(auVar8,auVar59);
      auVar9 = vpsrlw_avx2(auVar11,ZEXT416(4));
      auVar60._16_8_ = uStack_2170;
      auVar60._0_16_ = auVar3;
      auVar60._24_8_ = uStack_2168;
      auVar9 = vpand_avx2(auVar9,auVar60);
      auVar8 = vpaddb_avx2(auVar8,auVar9);
      auVar9 = vpsrlw_avx2(auVar12,ZEXT416(4));
      auVar61._16_8_ = uStack_2170;
      auVar61._0_16_ = auVar3;
      auVar61._24_8_ = uStack_2168;
      auVar9 = vpand_avx2(auVar9,auVar61);
      auVar10 = vpsrlw_avx2(auVar13,ZEXT416(4));
      auVar62._16_8_ = uStack_2170;
      auVar62._0_16_ = auVar3;
      auVar62._24_8_ = uStack_2168;
      auVar10 = vpand_avx2(auVar10,auVar62);
      auVar9 = vpaddb_avx2(auVar9,auVar10);
      auVar10 = vpand_avx2(auVar14,auVar215);
      auVar11 = vpand_avx2(auVar23,auVar215);
      auVar10 = vpaddb_avx2(auVar10,auVar11);
      auVar11 = vpand_avx2(auVar24,auVar215);
      auVar12 = vpand_avx2(auVar25,auVar215);
      auVar11 = vpaddb_avx2(auVar11,auVar12);
      auVar12 = vpand_avx2(auVar26,auVar215);
      auVar13 = vpand_avx2(auVar27,auVar215);
      auVar12 = vpaddb_avx2(auVar12,auVar13);
      auVar13 = vpand_avx2(auVar28,auVar215);
      auVar18 = vpand_avx2(auVar29,auVar215);
      auVar13 = vpaddb_avx2(auVar13,auVar18);
      auVar18 = vpand_avx2(auVar30,auVar215);
      auVar19 = vpand_avx2(auVar15,auVar215);
      auVar18 = vpaddb_avx2(auVar18,auVar19);
      auVar19 = vpand_avx2(auVar16,auVar215);
      auVar20 = vpand_avx2(auVar17,auVar215);
      auVar19 = vpaddb_avx2(auVar19,auVar20);
      auVar20 = vpand_avx2(auVar6,auVar215);
      auVar21 = vpand_avx2(auVar7,auVar215);
      auVar20 = vpaddb_avx2(auVar20,auVar21);
      auVar21 = vpand_avx2(auVar8,auVar215);
      auVar22 = vpand_avx2(auVar9,auVar215);
      auVar21 = vpaddb_avx2(auVar21,auVar22);
      auVar14 = vpsrlw_avx2(auVar14,ZEXT416(8));
      auVar14 = vpand_avx2(auVar14,auVar215);
      auVar23 = vpsrlw_avx2(auVar23,ZEXT416(8));
      auVar23 = vpand_avx2(auVar23,auVar215);
      auVar14 = vpaddb_avx2(auVar14,auVar23);
      auVar23 = vpsrlw_avx2(auVar24,ZEXT416(8));
      auVar23 = vpand_avx2(auVar23,auVar215);
      auVar24 = vpsrlw_avx2(auVar25,ZEXT416(8));
      auVar24 = vpand_avx2(auVar24,auVar215);
      auVar23 = vpaddb_avx2(auVar23,auVar24);
      auVar24 = vpsrlw_avx2(auVar26,ZEXT416(8));
      auVar24 = vpand_avx2(auVar24,auVar215);
      auVar25 = vpsrlw_avx2(auVar27,ZEXT416(8));
      auVar25 = vpand_avx2(auVar25,auVar215);
      auVar24 = vpaddb_avx2(auVar24,auVar25);
      auVar25 = vpsrlw_avx2(auVar28,ZEXT416(8));
      auVar25 = vpand_avx2(auVar25,auVar215);
      auVar26 = vpsrlw_avx2(auVar29,ZEXT416(8));
      auVar26 = vpand_avx2(auVar26,auVar215);
      auVar25 = vpaddb_avx2(auVar25,auVar26);
      auVar26 = vpsrlw_avx2(auVar30,ZEXT416(8));
      auVar26 = vpand_avx2(auVar26,auVar215);
      auVar27 = vpsrlw_avx2(auVar15,ZEXT416(8));
      auVar27 = vpand_avx2(auVar27,auVar215);
      auVar26 = vpaddb_avx2(auVar26,auVar27);
      auVar27 = vpsrlw_avx2(auVar16,ZEXT416(8));
      auVar27 = vpand_avx2(auVar27,auVar215);
      auVar28 = vpsrlw_avx2(auVar17,ZEXT416(8));
      auVar28 = vpand_avx2(auVar28,auVar215);
      auVar27 = vpaddb_avx2(auVar27,auVar28);
      auVar6 = vpsrlw_avx2(auVar6,ZEXT416(8));
      auVar6 = vpand_avx2(auVar6,auVar215);
      auVar7 = vpsrlw_avx2(auVar7,ZEXT416(8));
      auVar7 = vpand_avx2(auVar7,auVar215);
      auVar6 = vpaddb_avx2(auVar6,auVar7);
      auVar7 = vpsrlw_avx2(auVar8,ZEXT416(8));
      auVar7 = vpand_avx2(auVar7,auVar215);
      auVar8 = vpsrlw_avx2(auVar9,ZEXT416(8));
      auVar8 = vpand_avx2(auVar8,auVar215);
      auVar7 = vpaddb_avx2(auVar7,auVar8);
      local_4d20 = vpaddw_avx2(local_4d20,auVar10);
      local_4d00 = vpaddw_avx2(local_4d00,auVar11);
      local_4ce0 = vpaddw_avx2(local_4ce0,auVar12);
      local_4cc0 = vpaddw_avx2(local_4cc0,auVar13);
      local_4ca0 = vpaddw_avx2(local_4ca0,auVar18);
      local_4c80 = vpaddw_avx2(local_4c80,auVar19);
      local_4c60 = vpaddw_avx2(local_4c60,auVar20);
      local_4c40 = vpaddw_avx2(local_4c40,auVar21);
      local_4c20 = vpaddw_avx2(local_4c20,auVar14);
      local_4c00 = vpaddw_avx2(local_4c00,auVar23);
      local_4be0 = vpaddw_avx2(local_4be0,auVar24);
      local_4bc0 = vpaddw_avx2(local_4bc0,auVar25);
      local_4ba0 = vpaddw_avx2(local_4ba0,auVar26);
      local_4b80 = vpaddw_avx2(local_4b80,auVar27);
      local_4b60 = vpaddw_avx2(local_4b60,auVar6);
      local_4b40 = vpaddw_avx2(local_4b40,auVar7);
    }
    for (local_5808 = 0; local_5808 < 0x10; local_5808 = local_5808 + 1) {
      lVar214 = local_5808 * 0x20;
      local_4df0[0]._8_8_ = *(undefined8 *)(local_4d20 + lVar214 + 8);
      local_4df0[0]._0_8_ = *(undefined8 *)(local_4d20 + lVar214);
      local_4df0[0]._16_8_ = *(undefined8 *)(local_4d20 + lVar214 + 0x10);
      local_4df0[0]._24_8_ = *(undefined8 *)(local_4d00 + lVar214 + -8);
      for (local_580c = 0; local_580c < 0x10; local_580c = local_580c + 1) {
        *(uint *)(in_RDX + local_5808 * 4) =
             (uint)*(ushort *)(local_4df0[0] + (long)local_580c * 2) +
             *(int *)(in_RDX + local_5808 * 4);
      }
    }
    for (local_5818 = 0; local_5818 < 0x10; local_5818 = local_5818 + 1) {
      *(undefined1 (*) [32])(local_4d20 + local_5818 * 0x20) = ZEXT1632(ZEXT816(0));
    }
  }
  for (local_4df8 = local_4df8 << 0xc; local_4df8 < in_ESI >> 8; local_4df8 = local_4df8 + 1) {
    pauVar198 = (undefined1 (*) [32])(in_RDI + local_4df8 * 0x200);
    pauVar199 = (undefined1 (*) [32])(in_RDI + local_4df8 * 0x200 + 0x20);
    pauVar200 = (undefined1 (*) [32])(in_RDI + local_4df8 * 0x200 + 0x40);
    pauVar201 = (undefined1 (*) [32])(in_RDI + local_4df8 * 0x200 + 0x60);
    pauVar202 = (undefined1 (*) [32])(in_RDI + local_4df8 * 0x200 + 0x80);
    pauVar203 = (undefined1 (*) [32])(in_RDI + local_4df8 * 0x200 + 0xa0);
    pauVar204 = (undefined1 (*) [32])(in_RDI + local_4df8 * 0x200 + 0xc0);
    pauVar205 = (undefined1 (*) [32])(in_RDI + local_4df8 * 0x200 + 0xe0);
    pauVar206 = (undefined1 (*) [32])(in_RDI + local_4df8 * 0x200 + 0x100);
    pauVar207 = (undefined1 (*) [32])(in_RDI + local_4df8 * 0x200 + 0x120);
    pauVar208 = (undefined1 (*) [32])(in_RDI + local_4df8 * 0x200 + 0x140);
    pauVar209 = (undefined1 (*) [32])(in_RDI + local_4df8 * 0x200 + 0x160);
    pauVar210 = (undefined1 (*) [32])(in_RDI + local_4df8 * 0x200 + 0x180);
    pauVar211 = (undefined1 (*) [32])(in_RDI + local_4df8 * 0x200 + 0x1a0);
    pauVar212 = (undefined1 (*) [32])(in_RDI + local_4df8 * 0x200 + 0x1c0);
    pauVar213 = (undefined1 (*) [32])(in_RDI + local_4df8 * 0x200 + 0x1e0);
    auVar6._16_8_ = uStack_21f0;
    auVar6._0_16_ = auVar1;
    auVar6._24_8_ = uStack_21e8;
    auVar6 = vpand_avx2(*pauVar198,auVar6);
    auVar7._16_8_ = uStack_21f0;
    auVar7._0_16_ = auVar1;
    auVar7._24_8_ = uStack_21e8;
    auVar7 = vpand_avx2(*pauVar199,auVar7);
    auVar6 = vpaddb_avx2(auVar6,auVar7);
    auVar168._16_8_ = uStack_21f0;
    auVar168._0_16_ = auVar1;
    auVar168._24_8_ = uStack_21e8;
    auVar7 = vpand_avx2(*pauVar200,auVar168);
    auVar169._16_8_ = uStack_21f0;
    auVar169._0_16_ = auVar1;
    auVar169._24_8_ = uStack_21e8;
    auVar8 = vpand_avx2(*pauVar201,auVar169);
    auVar7 = vpaddb_avx2(auVar7,auVar8);
    auVar170._16_8_ = uStack_21f0;
    auVar170._0_16_ = auVar1;
    auVar170._24_8_ = uStack_21e8;
    auVar8 = vpand_avx2(*pauVar202,auVar170);
    auVar171._16_8_ = uStack_21f0;
    auVar171._0_16_ = auVar1;
    auVar171._24_8_ = uStack_21e8;
    auVar9 = vpand_avx2(*pauVar203,auVar171);
    auVar8 = vpaddb_avx2(auVar8,auVar9);
    auVar172._16_8_ = uStack_21f0;
    auVar172._0_16_ = auVar1;
    auVar172._24_8_ = uStack_21e8;
    auVar9 = vpand_avx2(*pauVar204,auVar172);
    auVar173._16_8_ = uStack_21f0;
    auVar173._0_16_ = auVar1;
    auVar173._24_8_ = uStack_21e8;
    auVar10 = vpand_avx2(*pauVar205,auVar173);
    auVar9 = vpaddb_avx2(auVar9,auVar10);
    auVar174._16_8_ = uStack_21f0;
    auVar174._0_16_ = auVar1;
    auVar174._24_8_ = uStack_21e8;
    auVar10 = vpand_avx2(*pauVar206,auVar174);
    auVar175._16_8_ = uStack_21f0;
    auVar175._0_16_ = auVar1;
    auVar175._24_8_ = uStack_21e8;
    auVar11 = vpand_avx2(*pauVar207,auVar175);
    auVar10 = vpaddb_avx2(auVar10,auVar11);
    auVar176._16_8_ = uStack_21f0;
    auVar176._0_16_ = auVar1;
    auVar176._24_8_ = uStack_21e8;
    auVar11 = vpand_avx2(*pauVar208,auVar176);
    auVar177._16_8_ = uStack_21f0;
    auVar177._0_16_ = auVar1;
    auVar177._24_8_ = uStack_21e8;
    auVar12 = vpand_avx2(*pauVar209,auVar177);
    auVar11 = vpaddb_avx2(auVar11,auVar12);
    auVar178._16_8_ = uStack_21f0;
    auVar178._0_16_ = auVar1;
    auVar178._24_8_ = uStack_21e8;
    auVar12 = vpand_avx2(*pauVar210,auVar178);
    auVar179._16_8_ = uStack_21f0;
    auVar179._0_16_ = auVar1;
    auVar179._24_8_ = uStack_21e8;
    auVar13 = vpand_avx2(*pauVar211,auVar179);
    auVar12 = vpaddb_avx2(auVar12,auVar13);
    auVar180._16_8_ = uStack_21f0;
    auVar180._0_16_ = auVar1;
    auVar180._24_8_ = uStack_21e8;
    auVar13 = vpand_avx2(*pauVar212,auVar180);
    auVar181._16_8_ = uStack_21f0;
    auVar181._0_16_ = auVar1;
    auVar181._24_8_ = uStack_21e8;
    auVar14 = vpand_avx2(*pauVar213,auVar181);
    auVar13 = vpaddb_avx2(auVar13,auVar14);
    auVar14 = vpsrlw_avx2(*pauVar198,ZEXT416(1));
    auVar182._16_8_ = uStack_21f0;
    auVar182._0_16_ = auVar1;
    auVar182._24_8_ = uStack_21e8;
    auVar14 = vpand_avx2(auVar14,auVar182);
    auVar23 = vpsrlw_avx2(*pauVar199,ZEXT416(1));
    auVar183._16_8_ = uStack_21f0;
    auVar183._0_16_ = auVar1;
    auVar183._24_8_ = uStack_21e8;
    auVar23 = vpand_avx2(auVar23,auVar183);
    auVar14 = vpaddb_avx2(auVar14,auVar23);
    auVar23 = vpsrlw_avx2(*pauVar200,ZEXT416(1));
    auVar184._16_8_ = uStack_21f0;
    auVar184._0_16_ = auVar1;
    auVar184._24_8_ = uStack_21e8;
    auVar23 = vpand_avx2(auVar23,auVar184);
    auVar24 = vpsrlw_avx2(*pauVar201,ZEXT416(1));
    auVar185._16_8_ = uStack_21f0;
    auVar185._0_16_ = auVar1;
    auVar185._24_8_ = uStack_21e8;
    auVar24 = vpand_avx2(auVar24,auVar185);
    auVar23 = vpaddb_avx2(auVar23,auVar24);
    auVar24 = vpsrlw_avx2(*pauVar202,ZEXT416(1));
    auVar186._16_8_ = uStack_21f0;
    auVar186._0_16_ = auVar1;
    auVar186._24_8_ = uStack_21e8;
    auVar24 = vpand_avx2(auVar24,auVar186);
    auVar25 = vpsrlw_avx2(*pauVar203,ZEXT416(1));
    auVar187._16_8_ = uStack_21f0;
    auVar187._0_16_ = auVar1;
    auVar187._24_8_ = uStack_21e8;
    auVar25 = vpand_avx2(auVar25,auVar187);
    auVar24 = vpaddb_avx2(auVar24,auVar25);
    auVar25 = vpsrlw_avx2(*pauVar204,ZEXT416(1));
    auVar188._16_8_ = uStack_21f0;
    auVar188._0_16_ = auVar1;
    auVar188._24_8_ = uStack_21e8;
    auVar25 = vpand_avx2(auVar25,auVar188);
    auVar26 = vpsrlw_avx2(*pauVar205,ZEXT416(1));
    auVar189._16_8_ = uStack_21f0;
    auVar189._0_16_ = auVar1;
    auVar189._24_8_ = uStack_21e8;
    auVar26 = vpand_avx2(auVar26,auVar189);
    auVar25 = vpaddb_avx2(auVar25,auVar26);
    auVar26 = vpsrlw_avx2(*pauVar206,ZEXT416(1));
    auVar190._16_8_ = uStack_21f0;
    auVar190._0_16_ = auVar1;
    auVar190._24_8_ = uStack_21e8;
    auVar26 = vpand_avx2(auVar26,auVar190);
    auVar27 = vpsrlw_avx2(*pauVar207,ZEXT416(1));
    auVar191._16_8_ = uStack_21f0;
    auVar191._0_16_ = auVar1;
    auVar191._24_8_ = uStack_21e8;
    auVar27 = vpand_avx2(auVar27,auVar191);
    auVar26 = vpaddb_avx2(auVar26,auVar27);
    auVar27 = vpsrlw_avx2(*pauVar208,ZEXT416(1));
    auVar192._16_8_ = uStack_21f0;
    auVar192._0_16_ = auVar1;
    auVar192._24_8_ = uStack_21e8;
    auVar27 = vpand_avx2(auVar27,auVar192);
    auVar28 = vpsrlw_avx2(*pauVar209,ZEXT416(1));
    auVar193._16_8_ = uStack_21f0;
    auVar193._0_16_ = auVar1;
    auVar193._24_8_ = uStack_21e8;
    auVar28 = vpand_avx2(auVar28,auVar193);
    auVar27 = vpaddb_avx2(auVar27,auVar28);
    auVar28 = vpsrlw_avx2(*pauVar210,ZEXT416(1));
    auVar194._16_8_ = uStack_21f0;
    auVar194._0_16_ = auVar1;
    auVar194._24_8_ = uStack_21e8;
    auVar28 = vpand_avx2(auVar28,auVar194);
    auVar29 = vpsrlw_avx2(*pauVar211,ZEXT416(1));
    auVar195._16_8_ = uStack_21f0;
    auVar195._0_16_ = auVar1;
    auVar195._24_8_ = uStack_21e8;
    auVar29 = vpand_avx2(auVar29,auVar195);
    auVar28 = vpaddb_avx2(auVar28,auVar29);
    auVar29 = vpsrlw_avx2(*pauVar212,ZEXT416(1));
    auVar196._16_8_ = uStack_21f0;
    auVar196._0_16_ = auVar1;
    auVar196._24_8_ = uStack_21e8;
    auVar29 = vpand_avx2(auVar29,auVar196);
    auVar30 = vpsrlw_avx2(*pauVar213,ZEXT416(1));
    auVar197._16_8_ = uStack_21f0;
    auVar197._0_16_ = auVar1;
    auVar197._24_8_ = uStack_21e8;
    auVar30 = vpand_avx2(auVar30,auVar197);
    auVar29 = vpaddb_avx2(auVar29,auVar30);
    auVar30._16_8_ = uStack_21b0;
    auVar30._0_16_ = auVar2;
    auVar30._24_8_ = uStack_21a8;
    auVar30 = vpand_avx2(auVar6,auVar30);
    auVar15._16_8_ = uStack_21b0;
    auVar15._0_16_ = auVar2;
    auVar15._24_8_ = uStack_21a8;
    auVar15 = vpand_avx2(auVar7,auVar15);
    auVar30 = vpaddb_avx2(auVar30,auVar15);
    auVar106._16_8_ = uStack_21b0;
    auVar106._0_16_ = auVar2;
    auVar106._24_8_ = uStack_21a8;
    auVar15 = vpand_avx2(auVar8,auVar106);
    auVar107._16_8_ = uStack_21b0;
    auVar107._0_16_ = auVar2;
    auVar107._24_8_ = uStack_21a8;
    auVar16 = vpand_avx2(auVar9,auVar107);
    auVar15 = vpaddb_avx2(auVar15,auVar16);
    auVar108._16_8_ = uStack_21b0;
    auVar108._0_16_ = auVar2;
    auVar108._24_8_ = uStack_21a8;
    auVar16 = vpand_avx2(auVar10,auVar108);
    auVar109._16_8_ = uStack_21b0;
    auVar109._0_16_ = auVar2;
    auVar109._24_8_ = uStack_21a8;
    auVar17 = vpand_avx2(auVar11,auVar109);
    auVar16 = vpaddb_avx2(auVar16,auVar17);
    auVar110._16_8_ = uStack_21b0;
    auVar110._0_16_ = auVar2;
    auVar110._24_8_ = uStack_21a8;
    auVar17 = vpand_avx2(auVar12,auVar110);
    auVar111._16_8_ = uStack_21b0;
    auVar111._0_16_ = auVar2;
    auVar111._24_8_ = uStack_21a8;
    auVar18 = vpand_avx2(auVar13,auVar111);
    auVar17 = vpaddb_avx2(auVar17,auVar18);
    auVar112._16_8_ = uStack_21b0;
    auVar112._0_16_ = auVar2;
    auVar112._24_8_ = uStack_21a8;
    auVar18 = vpand_avx2(auVar14,auVar112);
    auVar113._16_8_ = uStack_21b0;
    auVar113._0_16_ = auVar2;
    auVar113._24_8_ = uStack_21a8;
    auVar19 = vpand_avx2(auVar23,auVar113);
    auVar18 = vpaddb_avx2(auVar18,auVar19);
    auVar114._16_8_ = uStack_21b0;
    auVar114._0_16_ = auVar2;
    auVar114._24_8_ = uStack_21a8;
    auVar19 = vpand_avx2(auVar24,auVar114);
    auVar115._16_8_ = uStack_21b0;
    auVar115._0_16_ = auVar2;
    auVar115._24_8_ = uStack_21a8;
    auVar20 = vpand_avx2(auVar25,auVar115);
    auVar19 = vpaddb_avx2(auVar19,auVar20);
    auVar116._16_8_ = uStack_21b0;
    auVar116._0_16_ = auVar2;
    auVar116._24_8_ = uStack_21a8;
    auVar20 = vpand_avx2(auVar26,auVar116);
    auVar117._16_8_ = uStack_21b0;
    auVar117._0_16_ = auVar2;
    auVar117._24_8_ = uStack_21a8;
    auVar21 = vpand_avx2(auVar27,auVar117);
    auVar20 = vpaddb_avx2(auVar20,auVar21);
    auVar118._16_8_ = uStack_21b0;
    auVar118._0_16_ = auVar2;
    auVar118._24_8_ = uStack_21a8;
    auVar21 = vpand_avx2(auVar28,auVar118);
    auVar119._16_8_ = uStack_21b0;
    auVar119._0_16_ = auVar2;
    auVar119._24_8_ = uStack_21a8;
    auVar22 = vpand_avx2(auVar29,auVar119);
    auVar21 = vpaddb_avx2(auVar21,auVar22);
    auVar6 = vpsrlw_avx2(auVar6,ZEXT416(2));
    auVar120._16_8_ = uStack_21b0;
    auVar120._0_16_ = auVar2;
    auVar120._24_8_ = uStack_21a8;
    auVar6 = vpand_avx2(auVar6,auVar120);
    auVar7 = vpsrlw_avx2(auVar7,ZEXT416(2));
    auVar121._16_8_ = uStack_21b0;
    auVar121._0_16_ = auVar2;
    auVar121._24_8_ = uStack_21a8;
    auVar7 = vpand_avx2(auVar7,auVar121);
    auVar6 = vpaddb_avx2(auVar6,auVar7);
    auVar7 = vpsrlw_avx2(auVar8,ZEXT416(2));
    auVar122._16_8_ = uStack_21b0;
    auVar122._0_16_ = auVar2;
    auVar122._24_8_ = uStack_21a8;
    auVar7 = vpand_avx2(auVar7,auVar122);
    auVar8 = vpsrlw_avx2(auVar9,ZEXT416(2));
    auVar123._16_8_ = uStack_21b0;
    auVar123._0_16_ = auVar2;
    auVar123._24_8_ = uStack_21a8;
    auVar8 = vpand_avx2(auVar8,auVar123);
    auVar7 = vpaddb_avx2(auVar7,auVar8);
    auVar8 = vpsrlw_avx2(auVar10,ZEXT416(2));
    auVar124._16_8_ = uStack_21b0;
    auVar124._0_16_ = auVar2;
    auVar124._24_8_ = uStack_21a8;
    auVar8 = vpand_avx2(auVar8,auVar124);
    auVar9 = vpsrlw_avx2(auVar11,ZEXT416(2));
    auVar125._16_8_ = uStack_21b0;
    auVar125._0_16_ = auVar2;
    auVar125._24_8_ = uStack_21a8;
    auVar9 = vpand_avx2(auVar9,auVar125);
    auVar8 = vpaddb_avx2(auVar8,auVar9);
    auVar9 = vpsrlw_avx2(auVar12,ZEXT416(2));
    auVar126._16_8_ = uStack_21b0;
    auVar126._0_16_ = auVar2;
    auVar126._24_8_ = uStack_21a8;
    auVar9 = vpand_avx2(auVar9,auVar126);
    auVar10 = vpsrlw_avx2(auVar13,ZEXT416(2));
    auVar127._16_8_ = uStack_21b0;
    auVar127._0_16_ = auVar2;
    auVar127._24_8_ = uStack_21a8;
    auVar10 = vpand_avx2(auVar10,auVar127);
    auVar9 = vpaddb_avx2(auVar9,auVar10);
    auVar10 = vpsrlw_avx2(auVar14,ZEXT416(2));
    auVar128._16_8_ = uStack_21b0;
    auVar128._0_16_ = auVar2;
    auVar128._24_8_ = uStack_21a8;
    auVar10 = vpand_avx2(auVar10,auVar128);
    auVar11 = vpsrlw_avx2(auVar23,ZEXT416(2));
    auVar129._16_8_ = uStack_21b0;
    auVar129._0_16_ = auVar2;
    auVar129._24_8_ = uStack_21a8;
    auVar11 = vpand_avx2(auVar11,auVar129);
    auVar10 = vpaddb_avx2(auVar10,auVar11);
    auVar11 = vpsrlw_avx2(auVar24,ZEXT416(2));
    auVar130._16_8_ = uStack_21b0;
    auVar130._0_16_ = auVar2;
    auVar130._24_8_ = uStack_21a8;
    auVar11 = vpand_avx2(auVar11,auVar130);
    auVar12 = vpsrlw_avx2(auVar25,ZEXT416(2));
    auVar131._16_8_ = uStack_21b0;
    auVar131._0_16_ = auVar2;
    auVar131._24_8_ = uStack_21a8;
    auVar12 = vpand_avx2(auVar12,auVar131);
    auVar11 = vpaddb_avx2(auVar11,auVar12);
    auVar12 = vpsrlw_avx2(auVar26,ZEXT416(2));
    auVar132._16_8_ = uStack_21b0;
    auVar132._0_16_ = auVar2;
    auVar132._24_8_ = uStack_21a8;
    auVar12 = vpand_avx2(auVar12,auVar132);
    auVar13 = vpsrlw_avx2(auVar27,ZEXT416(2));
    auVar133._16_8_ = uStack_21b0;
    auVar133._0_16_ = auVar2;
    auVar133._24_8_ = uStack_21a8;
    auVar13 = vpand_avx2(auVar13,auVar133);
    auVar12 = vpaddb_avx2(auVar12,auVar13);
    auVar13 = vpsrlw_avx2(auVar28,ZEXT416(2));
    auVar134._16_8_ = uStack_21b0;
    auVar134._0_16_ = auVar2;
    auVar134._24_8_ = uStack_21a8;
    auVar13 = vpand_avx2(auVar13,auVar134);
    auVar14 = vpsrlw_avx2(auVar29,ZEXT416(2));
    auVar135._16_8_ = uStack_21b0;
    auVar135._0_16_ = auVar2;
    auVar135._24_8_ = uStack_21a8;
    auVar14 = vpand_avx2(auVar14,auVar135);
    auVar13 = vpaddb_avx2(auVar13,auVar14);
    auVar14._16_8_ = uStack_2170;
    auVar14._0_16_ = auVar3;
    auVar14._24_8_ = uStack_2168;
    auVar14 = vpand_avx2(auVar30,auVar14);
    auVar23._16_8_ = uStack_2170;
    auVar23._0_16_ = auVar3;
    auVar23._24_8_ = uStack_2168;
    auVar23 = vpand_avx2(auVar15,auVar23);
    auVar14 = vpaddb_avx2(auVar14,auVar23);
    auVar24._16_8_ = uStack_2170;
    auVar24._0_16_ = auVar3;
    auVar24._24_8_ = uStack_2168;
    auVar23 = vpand_avx2(auVar16,auVar24);
    auVar25._16_8_ = uStack_2170;
    auVar25._0_16_ = auVar3;
    auVar25._24_8_ = uStack_2168;
    auVar24 = vpand_avx2(auVar17,auVar25);
    auVar23 = vpaddb_avx2(auVar23,auVar24);
    auVar26._16_8_ = uStack_2170;
    auVar26._0_16_ = auVar3;
    auVar26._24_8_ = uStack_2168;
    auVar24 = vpand_avx2(auVar18,auVar26);
    auVar27._16_8_ = uStack_2170;
    auVar27._0_16_ = auVar3;
    auVar27._24_8_ = uStack_2168;
    auVar25 = vpand_avx2(auVar19,auVar27);
    auVar24 = vpaddb_avx2(auVar24,auVar25);
    auVar28._16_8_ = uStack_2170;
    auVar28._0_16_ = auVar3;
    auVar28._24_8_ = uStack_2168;
    auVar25 = vpand_avx2(auVar20,auVar28);
    auVar29._16_8_ = uStack_2170;
    auVar29._0_16_ = auVar3;
    auVar29._24_8_ = uStack_2168;
    auVar26 = vpand_avx2(auVar21,auVar29);
    auVar25 = vpaddb_avx2(auVar25,auVar26);
    auVar22._16_8_ = uStack_2170;
    auVar22._0_16_ = auVar3;
    auVar22._24_8_ = uStack_2168;
    auVar26 = vpand_avx2(auVar6,auVar22);
    auVar63._16_8_ = uStack_2170;
    auVar63._0_16_ = auVar3;
    auVar63._24_8_ = uStack_2168;
    auVar27 = vpand_avx2(auVar7,auVar63);
    auVar26 = vpaddb_avx2(auVar26,auVar27);
    auVar64._16_8_ = uStack_2170;
    auVar64._0_16_ = auVar3;
    auVar64._24_8_ = uStack_2168;
    auVar27 = vpand_avx2(auVar8,auVar64);
    auVar65._16_8_ = uStack_2170;
    auVar65._0_16_ = auVar3;
    auVar65._24_8_ = uStack_2168;
    auVar28 = vpand_avx2(auVar9,auVar65);
    auVar27 = vpaddb_avx2(auVar27,auVar28);
    auVar66._16_8_ = uStack_2170;
    auVar66._0_16_ = auVar3;
    auVar66._24_8_ = uStack_2168;
    auVar28 = vpand_avx2(auVar10,auVar66);
    auVar67._16_8_ = uStack_2170;
    auVar67._0_16_ = auVar3;
    auVar67._24_8_ = uStack_2168;
    auVar29 = vpand_avx2(auVar11,auVar67);
    auVar28 = vpaddb_avx2(auVar28,auVar29);
    auVar68._16_8_ = uStack_2170;
    auVar68._0_16_ = auVar3;
    auVar68._24_8_ = uStack_2168;
    auVar29 = vpand_avx2(auVar12,auVar68);
    auVar69._16_8_ = uStack_2170;
    auVar69._0_16_ = auVar3;
    auVar69._24_8_ = uStack_2168;
    auVar22 = vpand_avx2(auVar13,auVar69);
    auVar29 = vpaddb_avx2(auVar29,auVar22);
    auVar30 = vpsrlw_avx2(auVar30,ZEXT416(4));
    auVar70._16_8_ = uStack_2170;
    auVar70._0_16_ = auVar3;
    auVar70._24_8_ = uStack_2168;
    auVar30 = vpand_avx2(auVar30,auVar70);
    auVar15 = vpsrlw_avx2(auVar15,ZEXT416(4));
    auVar71._16_8_ = uStack_2170;
    auVar71._0_16_ = auVar3;
    auVar71._24_8_ = uStack_2168;
    auVar15 = vpand_avx2(auVar15,auVar71);
    auVar30 = vpaddb_avx2(auVar30,auVar15);
    auVar15 = vpsrlw_avx2(auVar16,ZEXT416(4));
    auVar16._16_8_ = uStack_2170;
    auVar16._0_16_ = auVar3;
    auVar16._24_8_ = uStack_2168;
    auVar15 = vpand_avx2(auVar15,auVar16);
    auVar16 = vpsrlw_avx2(auVar17,ZEXT416(4));
    auVar17._16_8_ = uStack_2170;
    auVar17._0_16_ = auVar3;
    auVar17._24_8_ = uStack_2168;
    auVar16 = vpand_avx2(auVar16,auVar17);
    auVar15 = vpaddb_avx2(auVar15,auVar16);
    auVar16 = vpsrlw_avx2(auVar18,ZEXT416(4));
    auVar18._16_8_ = uStack_2170;
    auVar18._0_16_ = auVar3;
    auVar18._24_8_ = uStack_2168;
    auVar16 = vpand_avx2(auVar16,auVar18);
    auVar17 = vpsrlw_avx2(auVar19,ZEXT416(4));
    auVar19._16_8_ = uStack_2170;
    auVar19._0_16_ = auVar3;
    auVar19._24_8_ = uStack_2168;
    auVar17 = vpand_avx2(auVar17,auVar19);
    auVar16 = vpaddb_avx2(auVar16,auVar17);
    auVar17 = vpsrlw_avx2(auVar20,ZEXT416(4));
    auVar20._16_8_ = uStack_2170;
    auVar20._0_16_ = auVar3;
    auVar20._24_8_ = uStack_2168;
    auVar17 = vpand_avx2(auVar17,auVar20);
    auVar18 = vpsrlw_avx2(auVar21,ZEXT416(4));
    auVar21._16_8_ = uStack_2170;
    auVar21._0_16_ = auVar3;
    auVar21._24_8_ = uStack_2168;
    auVar18 = vpand_avx2(auVar18,auVar21);
    auVar17 = vpaddb_avx2(auVar17,auVar18);
    auVar6 = vpsrlw_avx2(auVar6,ZEXT416(4));
    auVar72._16_8_ = uStack_2170;
    auVar72._0_16_ = auVar3;
    auVar72._24_8_ = uStack_2168;
    auVar6 = vpand_avx2(auVar6,auVar72);
    auVar7 = vpsrlw_avx2(auVar7,ZEXT416(4));
    auVar73._16_8_ = uStack_2170;
    auVar73._0_16_ = auVar3;
    auVar73._24_8_ = uStack_2168;
    auVar7 = vpand_avx2(auVar7,auVar73);
    auVar6 = vpaddb_avx2(auVar6,auVar7);
    auVar7 = vpsrlw_avx2(auVar8,ZEXT416(4));
    auVar8._16_8_ = uStack_2170;
    auVar8._0_16_ = auVar3;
    auVar8._24_8_ = uStack_2168;
    auVar7 = vpand_avx2(auVar7,auVar8);
    auVar8 = vpsrlw_avx2(auVar9,ZEXT416(4));
    auVar9._16_8_ = uStack_2170;
    auVar9._0_16_ = auVar3;
    auVar9._24_8_ = uStack_2168;
    auVar8 = vpand_avx2(auVar8,auVar9);
    auVar7 = vpaddb_avx2(auVar7,auVar8);
    auVar8 = vpsrlw_avx2(auVar10,ZEXT416(4));
    auVar10._16_8_ = uStack_2170;
    auVar10._0_16_ = auVar3;
    auVar10._24_8_ = uStack_2168;
    auVar8 = vpand_avx2(auVar8,auVar10);
    auVar9 = vpsrlw_avx2(auVar11,ZEXT416(4));
    auVar11._16_8_ = uStack_2170;
    auVar11._0_16_ = auVar3;
    auVar11._24_8_ = uStack_2168;
    auVar9 = vpand_avx2(auVar9,auVar11);
    auVar8 = vpaddb_avx2(auVar8,auVar9);
    auVar9 = vpsrlw_avx2(auVar12,ZEXT416(4));
    auVar12._16_8_ = uStack_2170;
    auVar12._0_16_ = auVar3;
    auVar12._24_8_ = uStack_2168;
    auVar9 = vpand_avx2(auVar9,auVar12);
    auVar10 = vpsrlw_avx2(auVar13,ZEXT416(4));
    auVar13._16_8_ = uStack_2170;
    auVar13._0_16_ = auVar3;
    auVar13._24_8_ = uStack_2168;
    auVar10 = vpand_avx2(auVar10,auVar13);
    auVar9 = vpaddb_avx2(auVar9,auVar10);
    auVar10 = vpand_avx2(auVar14,auVar215);
    auVar11 = vpand_avx2(auVar23,auVar215);
    auVar10 = vpaddb_avx2(auVar10,auVar11);
    auVar11 = vpand_avx2(auVar24,auVar215);
    auVar12 = vpand_avx2(auVar25,auVar215);
    auVar11 = vpaddb_avx2(auVar11,auVar12);
    auVar12 = vpand_avx2(auVar26,auVar215);
    auVar13 = vpand_avx2(auVar27,auVar215);
    auVar12 = vpaddb_avx2(auVar12,auVar13);
    auVar13 = vpand_avx2(auVar28,auVar215);
    auVar18 = vpand_avx2(auVar29,auVar215);
    auVar13 = vpaddb_avx2(auVar13,auVar18);
    auVar18 = vpand_avx2(auVar30,auVar215);
    auVar19 = vpand_avx2(auVar15,auVar215);
    auVar18 = vpaddb_avx2(auVar18,auVar19);
    auVar19 = vpand_avx2(auVar16,auVar215);
    auVar20 = vpand_avx2(auVar17,auVar215);
    auVar19 = vpaddb_avx2(auVar19,auVar20);
    auVar20 = vpand_avx2(auVar6,auVar215);
    auVar21 = vpand_avx2(auVar7,auVar215);
    auVar20 = vpaddb_avx2(auVar20,auVar21);
    auVar21 = vpand_avx2(auVar8,auVar215);
    auVar22 = vpand_avx2(auVar9,auVar215);
    auVar21 = vpaddb_avx2(auVar21,auVar22);
    auVar14 = vpsrlw_avx2(auVar14,ZEXT416(8));
    auVar14 = vpand_avx2(auVar14,auVar215);
    auVar23 = vpsrlw_avx2(auVar23,ZEXT416(8));
    auVar23 = vpand_avx2(auVar23,auVar215);
    auVar14 = vpaddb_avx2(auVar14,auVar23);
    auVar23 = vpsrlw_avx2(auVar24,ZEXT416(8));
    auVar23 = vpand_avx2(auVar23,auVar215);
    auVar24 = vpsrlw_avx2(auVar25,ZEXT416(8));
    auVar24 = vpand_avx2(auVar24,auVar215);
    auVar23 = vpaddb_avx2(auVar23,auVar24);
    auVar24 = vpsrlw_avx2(auVar26,ZEXT416(8));
    auVar24 = vpand_avx2(auVar24,auVar215);
    auVar25 = vpsrlw_avx2(auVar27,ZEXT416(8));
    auVar25 = vpand_avx2(auVar25,auVar215);
    auVar24 = vpaddb_avx2(auVar24,auVar25);
    auVar25 = vpsrlw_avx2(auVar28,ZEXT416(8));
    auVar25 = vpand_avx2(auVar25,auVar215);
    auVar26 = vpsrlw_avx2(auVar29,ZEXT416(8));
    auVar26 = vpand_avx2(auVar26,auVar215);
    auVar25 = vpaddb_avx2(auVar25,auVar26);
    auVar26 = vpsrlw_avx2(auVar30,ZEXT416(8));
    auVar26 = vpand_avx2(auVar26,auVar215);
    auVar27 = vpsrlw_avx2(auVar15,ZEXT416(8));
    auVar27 = vpand_avx2(auVar27,auVar215);
    auVar26 = vpaddb_avx2(auVar26,auVar27);
    auVar27 = vpsrlw_avx2(auVar16,ZEXT416(8));
    auVar27 = vpand_avx2(auVar27,auVar215);
    auVar28 = vpsrlw_avx2(auVar17,ZEXT416(8));
    auVar28 = vpand_avx2(auVar28,auVar215);
    auVar27 = vpaddb_avx2(auVar27,auVar28);
    auVar6 = vpsrlw_avx2(auVar6,ZEXT416(8));
    auVar6 = vpand_avx2(auVar6,auVar215);
    auVar7 = vpsrlw_avx2(auVar7,ZEXT416(8));
    auVar7 = vpand_avx2(auVar7,auVar215);
    auVar6 = vpaddb_avx2(auVar6,auVar7);
    auVar7 = vpsrlw_avx2(auVar8,ZEXT416(8));
    auVar7 = vpand_avx2(auVar7,auVar215);
    auVar8 = vpsrlw_avx2(auVar9,ZEXT416(8));
    auVar8 = vpand_avx2(auVar8,auVar215);
    auVar7 = vpaddb_avx2(auVar7,auVar8);
    local_4d20 = vpaddw_avx2(local_4d20,auVar10);
    local_4d00 = vpaddw_avx2(local_4d00,auVar11);
    local_4ce0 = vpaddw_avx2(local_4ce0,auVar12);
    local_4cc0 = vpaddw_avx2(local_4cc0,auVar13);
    local_4ca0 = vpaddw_avx2(local_4ca0,auVar18);
    local_4c80 = vpaddw_avx2(local_4c80,auVar19);
    local_4c60 = vpaddw_avx2(local_4c60,auVar20);
    local_4c40 = vpaddw_avx2(local_4c40,auVar21);
    local_4c20 = vpaddw_avx2(local_4c20,auVar14);
    local_4c00 = vpaddw_avx2(local_4c00,auVar23);
    local_4be0 = vpaddw_avx2(local_4be0,auVar24);
    local_4bc0 = vpaddw_avx2(local_4bc0,auVar25);
    local_4ba0 = vpaddw_avx2(local_4ba0,auVar26);
    local_4b80 = vpaddw_avx2(local_4b80,auVar27);
    local_4b60 = vpaddw_avx2(local_4b60,auVar6);
    local_4b40 = vpaddw_avx2(local_4b40,auVar7);
  }
  for (local_4df8 = local_4df8 << 8; local_4df8 < in_ESI; local_4df8 = local_4df8 + 1) {
    for (local_6224 = 0; local_6224 < 0x10; local_6224 = local_6224 + 1) {
      *(int *)(in_RDX + (long)local_6224 * 4) =
           ((int)((uint)*(ushort *)(in_RDI + local_4df8 * 2) & 1 << ((byte)local_6224 & 0x1f)) >>
           ((byte)local_6224 & 0x1f)) + *(int *)(in_RDX + (long)local_6224 * 4);
    }
  }
  for (local_6230 = 0; local_6230 < 0x10; local_6230 = local_6230 + 1) {
    lVar214 = local_6230 * 0x20;
    local_4df0[0]._8_8_ = *(undefined8 *)(local_4d20 + lVar214 + 8);
    local_4df0[0]._0_8_ = *(undefined8 *)(local_4d20 + lVar214);
    local_4df0[0]._16_8_ = *(undefined8 *)(local_4d20 + lVar214 + 0x10);
    local_4df0[0]._24_8_ = *(undefined8 *)(local_4d00 + lVar214 + -8);
    for (local_6234 = 0; local_6234 < 0x10; local_6234 = local_6234 + 1) {
      *(uint *)(in_RDX + local_6230 * 4) =
           (uint)*(ushort *)(local_4df0[0] + (long)local_6234 * 2) +
           *(int *)(in_RDX + local_6230 * 4);
    }
  }
  return 0;
}

Assistant:

int pospopcnt_u16_avx2_adder_forest(const uint16_t* array, uint32_t len, uint32_t* flags) {
    __m256i counters[16];

    for (size_t i = 0; i < 16; ++i) {
        counters[i] = _mm256_setzero_si256();
    }

    const __m256i mask1bit = _mm256_set1_epi16(0x5555); // 0101010101010101
    const __m256i mask2bit = _mm256_set1_epi16(0x3333); // 0011001100110011
    const __m256i mask4bit = _mm256_set1_epi16(0x0F0F); // 1111000011110000
    const __m256i mask8bit = _mm256_set1_epi16(0x00FF); // 0000000011111111
    
    const uint32_t n_cycles = len / (4096 * (16*16));
    const uint32_t n_total  = len / (16*16);
    uint16_t tmp[16];

/*------ Macros --------*/
#define LL(i,p,k)  const __m256i sum##p##k##_##i##bit_even = _mm256_add_epi8(input##p & mask##i##bit, input##k & mask##i##bit);
#define LO(i,p,k)  const __m256i sum##p##k##_##i##bit_odd  = _mm256_add_epi8(_mm256_srli_epi16(input##p, i) & mask##i##bit, _mm256_srli_epi16(input##k, i) & mask##i##bit);

#define LBLOCK(i)                                 \
    LL(i,0,1) LL(i,2,3)   LL(i,4,5)   LL(i,6,7)   \
    LL(i,8,9) LL(i,10,11) LL(i,12,13) LL(i,14,15) \
    LO(i,0,1) LO(i,2,3)   LO(i,4,5)   LO(i,6,7)   \
    LO(i,8,9) LO(i,10,11) LO(i,12,13) LO(i,14,15)

#define EVEN(b,i,k,p) input##i = sum##k##p##_##b##bit_even;
#define ODD(b,i,k,p)  input##i = sum##k##p##_##b##bit_odd;

#define UPDATE(i)                                                  \
    EVEN(i,0,0,1) EVEN(i,1,2,3)   EVEN(i,2,4,5)   EVEN(i,3,6,7)    \
    EVEN(i,4,8,9) EVEN(i,5,10,11) EVEN(i,6,12,13) EVEN(i,7,14,15)  \
     ODD(i,8,0,1)  ODD(i,9,2,3)    ODD(i,10,4,5)   ODD(i,11,6,7)   \
     ODD(i,12,8,9) ODD(i,13,10,11) ODD(i,14,12,13) ODD(i,15,14,15) \

#define UE(i,p,k) counters[i] = _mm256_add_epi16(counters[i], sum##p##k##_8bit_even);
#define UO(i,p,k) counters[i] = _mm256_add_epi16(counters[i], sum##p##k##_8bit_odd);

/*------ Start --------*/
#define L(p) __m256i input##p = _mm256_loadu_si256((__m256i*)(array + i*4096*256 + j*256 + p*16));
    size_t i = 0;
    for (/**/; i < n_cycles; ++i) {
        for (int j = 0; j < 4096; ++j) {
            // Load 16 registers.
            L(0)  L(1)  L(2)  L(3)  
            L(4)  L(5)  L(6)  L(7) 
            L(8)  L(9)  L(10) L(11) 
            L(12) L(13) L(14) L(15)

            // Perform updates for bits {1,2,4,8}.
            LBLOCK(1) UPDATE(1)
            LBLOCK(2) UPDATE(2)
            LBLOCK(4) UPDATE(4)
            LBLOCK(8) UPDATE(8)

            // Update accumulators.
            UE( 0,0,1) UE( 1, 2, 3) UE( 2, 4, 5) UE( 3, 6, 7)  
            UE( 4,8,9) UE( 5,10,11) UE( 6,12,13) UE( 7,14,15) 
            UO( 8,0,1) UO( 9, 2, 3) UO(10, 4, 5) UO(11, 6, 7) 
            UO(12,8,9) UO(13,10,11) UO(14,12,13) UO(15,14,15)
        }

        // Update.
        for (size_t i = 0; i < 16; ++i) {
            _mm256_storeu_si256((__m256i*)tmp, counters[i]);
            for (int j = 0; j < 16; ++j)
                flags[i] += tmp[j];
        }
        // Reset.
        for (size_t i = 0; i < 16; ++i) {
            counters[i] = _mm256_setzero_si256();
        }
    }
#undef L
#define L(p) __m256i input##p = _mm256_loadu_si256((__m256i*)(array + i*256 + p*16));
    i *= 4096;
    for (/**/; i < n_total; ++i) {
        // Load 16 registers.
        L(0)  L(1)  L(2)  L(3)  
        L(4)  L(5)  L(6)  L(7) 
        L(8)  L(9)  L(10) L(11) 
        L(12) L(13) L(14) L(15)

        // Perform updates for bits {1,2,4,8}.
        LBLOCK(1) UPDATE(1)
        LBLOCK(2) UPDATE(2)
        LBLOCK(4) UPDATE(4)
        LBLOCK(8) UPDATE(8)

        // Update accumulators.
        UE( 0,0,1) UE( 1, 2, 3) UE( 2, 4, 5) UE( 3, 6, 7)  
        UE( 4,8,9) UE( 5,10,11) UE( 6,12,13) UE( 7,14,15) 
        UO( 8,0,1) UO( 9, 2, 3) UO(10, 4, 5) UO(11, 6, 7) 
        UO(12,8,9) UO(13,10,11) UO(14,12,13) UO(15,14,15)
    }

    i *= 256;
    for (/**/; i < len; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((array[i] & (1 << j)) >> j);
        }
    }

#undef L
#undef UPDATE
#undef ODD
#undef EVEN
#undef LBLOCK
#undef LL
#undef LO
#undef UO
#undef UE

    for (size_t i = 0; i < 16; ++i) {
        _mm256_storeu_si256((__m256i*)tmp, counters[i]);
        for (int j = 0; j < 16; ++j)
            flags[i] += tmp[j];
    }
    return 0;
}